

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_2.h
# Opt level: O0

void __thiscall PlayerMike_2::~PlayerMike_2(PlayerMike_2 *this)

{
  PlayerMike_2 *in_RDI;
  
  ~PlayerMike_2(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

PlayerMike_2(const std::string& name) :
      Player(name),
      m_histSize(2),
      m_predictMe(3),
      m_predictYou(3)
   {}